

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object_object.cpp
# Opt level: O0

bool mjs::anon_unknown_33::check_for_immutability(object_ptr *o,property_attribute attr)

{
  bool bVar1;
  property_attribute attributes;
  object *poVar2;
  wstring_view wVar3;
  wstring_view local_80 [2];
  string *local_60;
  string *p;
  __normal_iterator<mjs::string_*,_std::vector<mjs::string,_std::allocator<mjs::string>_>_> local_50
  ;
  iterator __end2;
  iterator __begin2;
  vector<mjs::string,_std::allocator<mjs::string>_> *__range2;
  property_attribute attr_local;
  object_ptr *o_local;
  
  poVar2 = gc_heap_ptr<mjs::object>::operator->(o);
  bVar1 = object::is_extensible(poVar2);
  if (bVar1) {
    o_local._7_1_ = 0;
  }
  else {
    poVar2 = gc_heap_ptr<mjs::object>::operator->(o);
    object::own_property_names
              ((vector<mjs::string,_std::allocator<mjs::string>_> *)&__begin2,poVar2,false);
    __end2 = std::vector<mjs::string,_std::allocator<mjs::string>_>::begin
                       ((vector<mjs::string,_std::allocator<mjs::string>_> *)&__begin2);
    local_50._M_current =
         (string *)
         std::vector<mjs::string,_std::allocator<mjs::string>_>::end
                   ((vector<mjs::string,_std::allocator<mjs::string>_> *)&__begin2);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=(&__end2,&local_50);
      if (!bVar1) break;
      local_60 = __gnu_cxx::
                 __normal_iterator<mjs::string_*,_std::vector<mjs::string,_std::allocator<mjs::string>_>_>
                 ::operator*(&__end2);
      poVar2 = gc_heap_ptr<mjs::object>::operator->(o);
      wVar3 = string::view(local_60);
      local_80[0] = wVar3;
      attributes = object::own_property_attributes(poVar2,local_80);
      bVar1 = has_attributes(attributes,attr);
      if (((bVar1 ^ 0xffU) & 1) != 0) {
        o_local._7_1_ = 0;
        p._4_4_ = 1;
        goto LAB_001a4400;
      }
      __gnu_cxx::
      __normal_iterator<mjs::string_*,_std::vector<mjs::string,_std::allocator<mjs::string>_>_>::
      operator++(&__end2);
    }
    p._4_4_ = 2;
LAB_001a4400:
    std::vector<mjs::string,_std::allocator<mjs::string>_>::~vector
              ((vector<mjs::string,_std::allocator<mjs::string>_> *)&__begin2);
    if (p._4_4_ != 1) {
      o_local._7_1_ = 1;
    }
  }
  return (bool)(o_local._7_1_ & 1);
}

Assistant:

bool check_for_immutability(const object_ptr& o, property_attribute attr) {
    if (o->is_extensible()) {
        return false;
    }
    for (const auto& p : o->own_property_names(false)) {
        if (!has_attributes(o->own_property_attributes(p.view()), attr)) {
            return false;
        }
    }
    return true;
}